

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

bool __thiscall QRowsRemoval::contains(QRowsRemoval *this,QModelIndex parent,int row)

{
  int iVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    bVar2 = ::comparesEqual(&parent,&this->parent_source);
    iVar1 = parent.r;
    if (bVar2) {
      bVar2 = row <= this->end && this->start <= row;
      goto LAB_00420d1a;
    }
    QModelIndex::parent(&local_40,&parent);
    parent.m.ptr = local_40.m.ptr;
    parent.r = local_40.r;
    parent.c = local_40.c;
    parent.i._0_4_ = (undefined4)local_40.i;
    parent.i._4_4_ = local_40.i._4_4_;
    row = iVar1;
  } while (-1 < iVar1);
  bVar2 = false;
LAB_00420d1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool contains(QModelIndex parent, int row) const
    {
        do {
            if (parent == parent_source)
                return row >= start && row <= end;
            row = parent.row();
            parent = parent.parent();
        } while (row >= 0);
        return false;
    }